

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

void __thiscall FileSystemUtils::Path::ReplaceExtension(Path *this,string *ext)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  ulong local_20;
  size_t pos;
  string *ext_local;
  Path *this_local;
  
  pos = (size_t)ext;
  ext_local = (string *)this;
  bVar1 = HasExtension(this);
  if (bVar1) {
    uVar2 = std::__cxx11::string::find_last_of((char)this + '\b',0x2e);
    local_20 = uVar2;
    uVar3 = std::__cxx11::string::length();
    if (uVar2 < uVar3) {
      local_38._M_current = (char *)std::__cxx11::string::begin();
      local_30 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_38,local_20);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
      local_48._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
      std::__cxx11::string::erase(&this->m_string,local_28,local_40);
    }
  }
  std::__cxx11::string::operator+=((string *)&this->m_string,(string *)pos);
  return;
}

Assistant:

inline void Path::ReplaceExtension( const std::string& ext )
	{
		if( HasExtension() )
		{
			size_t pos = m_string.find_last_of( '.' );
			if( pos < m_string.length() )
			{
				m_string.erase( m_string.begin() + pos, m_string.end() );
			}
		}
		m_string += ext;
	}